

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNIfBase::fold_constants(CTPNIfBase *this,CTcPrsSymtab *symtab)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 in_RSI;
  CTcConstVal *in_RDI;
  CTcConstVal *local_28;
  CTcConstVal *local_8;
  
  lVar3 = (**(code **)((long)(((in_RDI->val_).funcptrval_)->super_CTcSymFuncBase).super_CTcSymbol.
                             super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                             _vptr_CVmHashEntry + 0x78))((in_RDI->val_).funcptrval_,in_RSI);
  (in_RDI->val_).intval_ = lVar3;
  plVar1 = *(long **)&(in_RDI->val_).objval_.meta_;
  uVar4 = (**(code **)(*plVar1 + 0x78))(plVar1,in_RSI);
  *(undefined8 *)&(in_RDI->val_).objval_.meta_ = uVar4;
  plVar1 = *(long **)((long)&in_RDI->val_ + 0x10);
  uVar4 = (**(code **)(*plVar1 + 0x78))(plVar1,in_RSI);
  *(undefined8 *)((long)&in_RDI->val_ + 0x10) = uVar4;
  iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x25ac52);
  local_8 = in_RDI;
  if (iVar2 != 0) {
    (**(code **)((long)(((in_RDI->val_).funcptrval_)->super_CTcSymFuncBase).super_CTcSymbol.
                       super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                       _vptr_CVmHashEntry + 8))();
    iVar2 = CTcConstVal::get_val_bool(in_RDI);
    if (iVar2 == 0) {
      local_28 = *(CTcConstVal **)((long)&in_RDI->val_ + 0x10);
    }
    else {
      local_28 = (CTcConstVal *)(in_RDI->val_).floatval_.len_;
    }
    local_8 = local_28;
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTPNIfBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold constants in the subnodes */
    first_ = first_->fold_constants(symtab);
    second_ = second_->fold_constants(symtab);
    third_ = third_->fold_constants(symtab);

    /* 
     *   if the first is now a constant, we can fold this entire
     *   expression node by choosing the second or third based on its
     *   value; otherwise, return myself unchanged 
     */
    if (first_->is_const())
    {
        /* 
         *   The condition is a constant - the result is the 'then' or 'else'
         *   part, based on the condition's value.  
         */
        return (first_->get_const_val()->get_val_bool()
                ? second_ : third_);
    }
    else
    {
        /* we can't fold this node any further - return it unchanged */
        return this;
    }
}